

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O3

curl_slist * Curl_slist_duplicate(curl_slist *inlist)

{
  curl_slist *pcVar1;
  curl_slist *list;
  
  if (inlist == (curl_slist *)0x0) {
LAB_0011c58c:
    pcVar1 = (curl_slist *)0x0;
  }
  else {
    list = (curl_slist *)0x0;
    do {
      pcVar1 = curl_slist_append(list,inlist->data);
      if (pcVar1 == (curl_slist *)0x0) {
        if (list != (curl_slist *)0x0) {
          do {
            pcVar1 = list->next;
            (*Curl_cfree)(list->data);
            list->data = (char *)0x0;
            (*Curl_cfree)(list);
            list = pcVar1;
          } while (pcVar1 != (curl_slist *)0x0);
          return (curl_slist *)0x0;
        }
        goto LAB_0011c58c;
      }
      inlist = inlist->next;
      list = pcVar1;
    } while (inlist != (curl_slist *)0x0);
  }
  return pcVar1;
}

Assistant:

struct curl_slist *Curl_slist_duplicate(struct curl_slist *inlist)
{
  struct curl_slist *outlist = NULL;
  struct curl_slist *tmp;

  while(inlist) {
    tmp = curl_slist_append(outlist, inlist->data);

    if(!tmp) {
      curl_slist_free_all(outlist);
      return NULL;
    }

    outlist = tmp;
    inlist = inlist->next;
  }
  return outlist;
}